

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_lib.c
# Opt level: O0

BIGNUM * BN_copy(BIGNUM *a,BIGNUM *b)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  BIGNUM *pBVar4;
  unsigned_long a3;
  unsigned_long a2;
  unsigned_long a1;
  unsigned_long a0;
  unsigned_long *B;
  unsigned_long *A;
  int i;
  undefined8 in_stack_ffffffffffffffa8;
  BIGNUM *in_stack_ffffffffffffffb0;
  ulong *local_30;
  ulong *local_28;
  int local_1c;
  BIGNUM *local_8;
  
  local_8 = a;
  if (a != b) {
    pBVar4 = bn_wexpand(in_stack_ffffffffffffffb0,(int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
    if (pBVar4 == (BIGNUM *)0x0) {
      local_8 = (BIGNUM *)0x0;
    }
    else {
      local_28 = a->d;
      local_30 = b->d;
      for (local_1c = b->top >> 2; 0 < local_1c; local_1c = local_1c + -1) {
        uVar1 = local_30[1];
        uVar2 = local_30[2];
        uVar3 = local_30[3];
        *local_28 = *local_30;
        local_28[1] = uVar1;
        local_28[2] = uVar2;
        local_28[3] = uVar3;
        local_28 = local_28 + 4;
        local_30 = local_30 + 4;
      }
      switch(b->top & 3) {
      case 3:
        local_28[2] = local_30[2];
      case 2:
        local_28[1] = local_30[1];
      case 1:
        *local_28 = *local_30;
      case 0:
      default:
        a->top = b->top;
        a->neg = b->neg;
      }
    }
  }
  return local_8;
}

Assistant:

BIGNUM *BN_copy(BIGNUM *a, const BIGNUM *b)
{
    int i;
    BN_ULONG *A;
    const BN_ULONG *B;

    bn_check_top(b);

    if (a == b)
        return (a);
    if (bn_wexpand(a, b->top) == NULL)
        return (NULL);

    A = a->d;
    B = b->d;
    for (i = b->top >> 2; i > 0; i--, A += 4, B += 4) {
        BN_ULONG a0, a1, a2, a3;
        a0 = B[0];
        a1 = B[1];
        a2 = B[2];
        a3 = B[3];
        A[0] = a0;
        A[1] = a1;
        A[2] = a2;
        A[3] = a3;
    }
    /* ultrix cc workaround, see comments in bn_expand_internal */
    switch (b->top & 3) {
    case 3:
        A[2] = B[2];
    case 2:
        A[1] = B[1];
    case 1:
        A[0] = B[0];
    case 0:;
    }

    a->top = b->top;
    a->neg = b->neg;
    bn_check_top(a);
    return (a);
}